

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O2

bool __thiscall
glslang::TVarEntryInfo::TOrderByPriority::operator()
          (TOrderByPriority *this,TVarEntryInfo *l,TVarEntryInfo *r)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  byte bVar5;
  byte bVar6;
  
  iVar3 = (*(l->symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])();
  iVar4 = (*(r->symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])();
  uVar1 = *(ulong *)(CONCAT44(extraout_var,iVar3) + 0x1c);
  bVar5 = (((uint)uVar1 & 0x3f8000) != 0x1f8000) + ((~uVar1 & 0xffff00000000) != 0) * '\x02';
  uVar1 = *(ulong *)(CONCAT44(extraout_var_00,iVar4) + 0x1c);
  bVar6 = (((uint)uVar1 & 0x3f8000) != 0x1f8000) + ((~uVar1 & 0xffff00000000) != 0) * '\x02';
  bVar2 = l->id < r->id;
  if (bVar5 != bVar6) {
    bVar2 = bVar6 < bVar5;
  }
  return bVar2;
}

Assistant:

inline bool operator()(const TVarEntryInfo& l, const TVarEntryInfo& r) {
            const TQualifier& lq = l.symbol->getQualifier();
            const TQualifier& rq = r.symbol->getQualifier();

            // simple rules:
            // has binding gives 2 points
            // has set gives 1 point
            // who has the most points is more important.
            int lPoints = (lq.hasBinding() ? 2 : 0) + (lq.hasSet() ? 1 : 0);
            int rPoints = (rq.hasBinding() ? 2 : 0) + (rq.hasSet() ? 1 : 0);

            if (lPoints == rPoints)
                return l.id < r.id;
            return lPoints > rPoints;
        }